

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Serializer.cpp
# Opt level: O0

void __thiscall adios2::format::BP4Serializer::SerializeDataBuffer(BP4Serializer *this,IO *io)

{
  long lVar1;
  size_type sVar2;
  long *in_RDI;
  uint64_t dataPGLength;
  char pgiend [5];
  string *in_stack_00000050;
  size_t in_stack_00000058;
  BufferSTL *in_stack_00000060;
  size_t minSize_1;
  size_t minSize;
  size_t attributesSizeInData;
  uint64_t varsLength;
  size_t *absolutePosition;
  size_t *position;
  vector<char,_std::allocator<char>_> *buffer;
  IO *in_stack_000008d8;
  BPSerializer *in_stack_000008e0;
  IO *in_stack_00001cb8;
  BPSerializer *in_stack_00001cc0;
  unsigned_long *in_stack_ffffffffffffff60;
  undefined2 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6a;
  undefined4 uVar3;
  undefined1 in_stack_ffffffffffffff6e;
  undefined1 uVar4;
  allocator in_stack_ffffffffffffff6f;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  allocator local_61;
  string local_60 [32];
  ulong local_40;
  size_t local_38;
  long local_30;
  long *local_28;
  long *local_20;
  long local_18;
  
  local_18 = (long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x70;
  local_20 = (long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x60);
  local_28 = (long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x68);
  helper::CopyToBuffer<unsigned_int>
            (in_stack_ffffffffffffff70,
             (size_t *)
             CONCAT17(in_stack_ffffffffffffff6f,
                      CONCAT16(in_stack_ffffffffffffff6e,
                               CONCAT42(in_stack_ffffffffffffff6a,in_stack_ffffffffffffff68))),
             (uint *)in_stack_ffffffffffffff60,(size_t)in_RDI);
  local_30 = (*local_20 - *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1b8)) + -8;
  helper::CopyToBuffer<unsigned_long>
            (in_stack_ffffffffffffff70,
             (size_t *)
             CONCAT17(in_stack_ffffffffffffff6f,
                      CONCAT16(in_stack_ffffffffffffff6e,
                               CONCAT42(in_stack_ffffffffffffff6a,in_stack_ffffffffffffff68))),
             in_stack_ffffffffffffff60,(size_t)in_RDI);
  local_38 = BPSerializer::GetAttributesSizeInData(in_stack_000008e0,in_stack_000008d8);
  if (local_38 == 0) {
    lVar1 = *local_20;
    sVar2 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)
                       ((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x70));
    if (sVar2 < lVar1 + 0x10U) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffff70,"for empty Attributes\n",
                 (allocator *)&stack0xffffffffffffff6f);
      BufferSTL::Resize(in_stack_00000060,in_stack_00000058,in_stack_00000050);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff6f);
    }
    *local_20 = *local_20 + 0xc;
    *local_28 = *local_28 + 0xc;
  }
  else {
    local_38 = local_38 + 0xc;
    local_40 = *local_20 + local_38 + 4;
    sVar2 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)
                       ((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x70));
    if (sVar2 < local_40) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_60,"when writing Attributes in rank=0\n",&local_61);
      BufferSTL::Resize(in_stack_00000060,in_stack_00000058,in_stack_00000050);
      std::__cxx11::string::~string(local_60);
      std::allocator<char>::~allocator((allocator<char> *)&local_61);
    }
    BPSerializer::PutAttributes(in_stack_00001cc0,in_stack_00001cb8);
  }
  uVar3 = 0x5d494750;
  uVar4 = 0;
  helper::CopyToBuffer<char>
            (in_stack_ffffffffffffff70,
             (size_t *)
             CONCAT17(in_stack_ffffffffffffff6f,
                      (uint7)CONCAT42(0x5d494750,in_stack_ffffffffffffff68)),
             (char *)in_stack_ffffffffffffff60,(size_t)in_RDI);
  *local_28 = *local_28 + 4;
  helper::CopyToBuffer<unsigned_long>
            (in_stack_ffffffffffffff70,
             (size_t *)
             CONCAT17(in_stack_ffffffffffffff6f,
                      CONCAT16(uVar4,CONCAT42(uVar3,in_stack_ffffffffffffff68))),
             (unsigned_long *)
             (*local_20 - *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1a8)),
             (size_t)in_RDI);
  *(undefined1 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1c0) = 0;
  return;
}

Assistant:

void BP4Serializer::SerializeDataBuffer(core::IO &io) noexcept
{
    auto &buffer = m_Data.m_Buffer;
    auto &position = m_Data.m_Position;
    auto &absolutePosition = m_Data.m_AbsolutePosition;

    // vars count and Length (only for PG)
    helper::CopyToBuffer(buffer, m_MetadataSet.DataPGVarsCountPosition,
                         &m_MetadataSet.DataPGVarsCount);
    // without record itself and vars count
    // Note: m_MetadataSet.DataPGVarsCount has been incremented by 4
    // in previous CopyToBuffer operation!
    const uint64_t varsLength = position - m_MetadataSet.DataPGVarsCountPosition - 8;
    helper::CopyToBuffer(buffer, m_MetadataSet.DataPGVarsCountPosition, &varsLength);

    // each attribute is only written to output once
    size_t attributesSizeInData = GetAttributesSizeInData(io);
    if (attributesSizeInData)
    {
        attributesSizeInData += 12; // count + length + end ID
        // Take care not to shrink the buffer size in this.
        // Otherwise, growing the buffer again later on is expensive
        // - not because of reallocation, but because of (re)initialization
        // with zeros by BufferSTL::Resize.
        const size_t minSize = position + attributesSizeInData + 4;
        if (m_Data.m_Buffer.size() < minSize)
        {
            m_Data.Resize(minSize, "when writing Attributes in rank=0\n");
        }
        PutAttributes(io);
    }
    else
    {
        const size_t minSize = position + 12 + 4;
        if (m_Data.m_Buffer.size() < minSize)
        {
            m_Data.Resize(minSize, "for empty Attributes\n");
        }
        // Attribute index header for zero attributes: 0, 0LL
        // Resize() already takes care of this
        position += 12;
        absolutePosition += 12;
    }

    // write a block identifier PGI]
    const char pgiend[] = "PGI]"; // no \0
    helper::CopyToBuffer(buffer, position, pgiend, sizeof(pgiend) - 1);
    absolutePosition += sizeof(pgiend) - 1;

    // Finish writing pg group length INCLUDING the record itself and
    // including the closing padding but NOT the opening [PGI
    const uint64_t dataPGLength = position - m_MetadataSet.DataPGLengthPosition;
    helper::CopyToBuffer(buffer, m_MetadataSet.DataPGLengthPosition, &dataPGLength);

    m_MetadataSet.DataPGIsOpen = false;
}